

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall
c4::yml::detail::stack<c4::yml::detail::ReferenceResolver::refdata,_16UL>::push
          (stack<c4::yml::detail::ReferenceResolver::refdata,_16UL> *this,refdata *n)

{
  refdata *prVar1;
  code *pcVar2;
  NodeType_e NVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  bool bVar7;
  size_t sVar8;
  size_t sVar9;
  
  if ((this->m_stack <= n + 1) && (n <= this->m_stack + this->m_capacity)) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar7 = is_debugger_attached();
      if (bVar7) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    to_csubstr(
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              );
    (*(code *)PTR_error_impl_0022e4f8)
              ("check failed: (const char*)&n + sizeof(T) < (const char*)m_stack || &n > m_stack + m_capacity"
               ,0x5d,(anonymous_namespace)::s_default_callbacks);
  }
  sVar8 = this->m_size;
  if (sVar8 == this->m_capacity) {
    sVar9 = 0x10;
    if (sVar8 != 0) {
      sVar9 = sVar8 * 2;
    }
    reserve(this,sVar9);
    sVar8 = this->m_size;
  }
  prVar1 = this->m_stack;
  NVar3 = (n->type).type;
  sVar9 = n->node;
  sVar4 = n->prev_anchor;
  sVar5 = n->target;
  sVar6 = n->parent_ref_sibling;
  prVar1[sVar8].parent_ref = n->parent_ref;
  (&prVar1[sVar8].parent_ref)[1] = sVar6;
  prVar1[sVar8].prev_anchor = sVar4;
  (&prVar1[sVar8].prev_anchor)[1] = sVar5;
  prVar1[sVar8].type.type = NVar3;
  prVar1[sVar8].node = sVar9;
  this->m_size = this->m_size + 1;
  return;
}

Assistant:

void push(T const& C4_RESTRICT n)
    {
        RYML_ASSERT((const char*)&n + sizeof(T) < (const char*)m_stack || &n > m_stack + m_capacity);
        if(m_size == m_capacity)
        {
            size_t cap = m_capacity == 0 ? N : 2 * m_capacity;
            reserve(cap);
        }
        m_stack[m_size] = n;
        ++m_size;
    }